

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanOrder.c
# Opt level: O3

void Abc_NtkOrderFaninsByLitCount(Abc_Ntk_t *pNtk)

{
  ulong uVar1;
  size_t __size;
  char *pcVar2;
  char cVar3;
  uint uVar4;
  void *pvVar5;
  char *pSop;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  Vec_Int_t *p;
  int *piVar9;
  int *__ptr;
  void *pvVar10;
  Vec_Int_t *p_00;
  int *piVar11;
  long lVar12;
  char *pcVar13;
  Vec_Ptr_t *pVVar14;
  ulong uVar15;
  ulong uVar16;
  ulong __n;
  long lVar17;
  uint uVar18;
  char *pcVar19;
  ulong uVar20;
  ulong uVar21;
  uint local_6c;
  
  if (pNtk->ntkFunc != ABC_FUNC_SOP) {
    __assert_fail("Abc_NtkHasSop(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcFanOrder.c"
                  ,100,"void Abc_NtkOrderFaninsByLitCount(Abc_Ntk_t *)");
  }
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar9 = (int *)malloc(400);
  p->pArray = piVar9;
  __ptr = (int *)malloc(0x10);
  __ptr[0] = 100;
  __ptr[1] = 0;
  pvVar10 = malloc(100);
  *(void **)(__ptr + 2) = pvVar10;
  pvVar10 = malloc(400);
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar11 = (int *)malloc(400);
  p_00->pArray = piVar11;
  pVVar14 = pNtk->vObjs;
  if (0 < pVVar14->nSize) {
    local_6c = 100;
    lVar17 = 0;
    do {
      pvVar5 = pVVar14->pArray[lVar17];
      if ((pvVar5 != (void *)0x0) && ((*(uint *)((long)pvVar5 + 0x14) & 0xf) == 7)) {
        pSop = *(char **)((long)pvVar5 + 0x38);
        uVar7 = Abc_SopGetVarNum(pSop);
        if (uVar7 != *(uint *)((long)pvVar5 + 0x1c)) {
          __assert_fail("nVars == Abc_ObjFaninNum(pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcFanOrder.c"
                        ,0x6d,"void Abc_NtkOrderFaninsByLitCount(Abc_Ntk_t *)");
        }
        if ((int)local_6c < (int)uVar7) {
          __size = (long)(int)uVar7 * 4;
          if (pvVar10 == (void *)0x0) {
            pvVar10 = malloc(__size);
          }
          else {
            pvVar10 = realloc(pvVar10,__size);
          }
          local_6c = uVar7;
          if (pvVar10 == (void *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
        }
        __n = (ulong)uVar7;
        if (0 < (int)uVar7) {
          memset(pvVar10,0,__n * 4);
        }
        if (*pSop != '\0') {
          pcVar13 = pSop;
          do {
            if (0 < (int)uVar7) {
              uVar16 = 0;
              do {
                if (pcVar13[uVar16] != '-') {
                  piVar9 = (int *)((long)pvVar10 + uVar16 * 4);
                  *piVar9 = *piVar9 + 1;
                }
                uVar16 = uVar16 + 1;
              } while (__n != uVar16);
            }
            pcVar19 = pcVar13 + (int)(uVar7 + 3);
            pcVar13 = pcVar13 + (int)(uVar7 + 3);
          } while (*pcVar19 != '\0');
        }
        p->nSize = 0;
        if ((int)uVar7 < 1) {
          piVar9 = p->pArray;
        }
        else {
          uVar18 = 0;
          do {
            Vec_IntPush(p,uVar18);
            uVar18 = uVar18 + 1;
          } while (uVar7 != uVar18);
          piVar9 = p->pArray;
          if (uVar7 != 1) {
            uVar15 = 1;
            uVar16 = 0;
            do {
              uVar1 = uVar16 + 1;
              uVar21 = uVar16 & 0xffffffff;
              uVar20 = uVar15;
              do {
                uVar18 = piVar9[uVar20];
                if (((long)(int)uVar18 < 0) || (uVar7 <= uVar18)) {
LAB_001c87bf:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
                }
                uVar4 = piVar9[(int)uVar21];
                if (((long)(int)uVar4 < 0) || (uVar7 <= uVar4)) goto LAB_001c87bf;
                uVar6 = uVar20 & 0xffffffff;
                if (*(int *)((long)pvVar10 + (long)(int)uVar4 * 4) <=
                    *(int *)((long)pvVar10 + (long)(int)uVar18 * 4)) {
                  uVar6 = uVar21;
                }
                uVar21 = uVar6;
                uVar20 = uVar20 + 1;
              } while (__n != uVar20);
              iVar8 = piVar9[uVar16];
              piVar9[uVar16] = piVar9[(int)uVar21];
              piVar9[(int)uVar21] = iVar8;
              uVar15 = uVar15 + 1;
              uVar16 = uVar1;
            } while (uVar1 != uVar7 - 1);
          }
        }
        iVar8 = Abc_SopGetCubeNum(pSop);
        lVar12 = (long)(int)uVar7 + 3;
        iVar8 = iVar8 * (int)lVar12;
        pcVar13 = *(char **)(__ptr + 2);
        if (*__ptr <= iVar8) {
          iVar8 = iVar8 + 1;
          if (pcVar13 == (char *)0x0) {
            pcVar13 = (char *)malloc((long)iVar8);
          }
          else {
            pcVar13 = (char *)realloc(pcVar13,(long)iVar8);
          }
          *(char **)(__ptr + 2) = pcVar13;
          *__ptr = iVar8;
        }
        iVar8 = Abc_SopGetCubeNum(pSop);
        memcpy(pcVar13,pSop,(long)(iVar8 * (int)lVar12 + 1));
        cVar3 = *pcVar13;
        pcVar19 = pSop;
        while (cVar3 != '\0') {
          if (0 < (int)uVar7) {
            memset(pcVar19,0x2d,__n);
            uVar16 = 0;
            do {
              if ((pcVar13[piVar9[uVar16]] & 0xfeU) == 0x30) {
                pcVar19[uVar16] = pcVar13[piVar9[uVar16]];
              }
              uVar16 = uVar16 + 1;
            } while (__n != uVar16);
          }
          pcVar19 = pcVar19 + lVar12;
          pcVar2 = pcVar13 + lVar12;
          pcVar13 = pcVar13 + lVar12;
          cVar3 = *pcVar2;
        }
        *(char **)((long)pvVar5 + 0x38) = pSop;
        p_00->nSize = 0;
        if ((int)uVar7 < 1) {
          *(undefined4 *)((long)pvVar5 + 0x1c) = 0;
        }
        else {
          uVar16 = 0;
          do {
            Vec_IntPush(p_00,*(int *)(*(long *)((long)pvVar5 + 0x20) + (long)piVar9[uVar16] * 4));
            uVar16 = uVar16 + 1;
          } while (__n != uVar16);
          iVar8 = p_00->nSize;
          *(undefined4 *)((long)pvVar5 + 0x1c) = 0;
          if (0 < (long)iVar8) {
            piVar11 = p_00->pArray;
            lVar12 = 0;
            do {
              Vec_IntPush((Vec_Int_t *)((long)pvVar5 + 0x18),piVar11[lVar12]);
              lVar12 = lVar12 + 1;
            } while (iVar8 != lVar12);
          }
        }
      }
      lVar17 = lVar17 + 1;
      pVVar14 = pNtk->vObjs;
    } while (lVar17 < pVVar14->nSize);
    piVar11 = p_00->pArray;
  }
  if (piVar11 != (int *)0x0) {
    free(piVar11);
  }
  free(p_00);
  if (pvVar10 != (void *)0x0) {
    free(pvVar10);
    piVar9 = p->pArray;
  }
  if (piVar9 != (int *)0x0) {
    free(piVar9);
  }
  free(p);
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
  }
  free(__ptr);
  return;
}

Assistant:

void Abc_NtkOrderFaninsByLitCount( Abc_Ntk_t * pNtk )
{
    Vec_Int_t * vOrder;
    Vec_Int_t * vCounts;
    Vec_Int_t * vFanins;
    Vec_Str_t * vStore;
    Abc_Obj_t * pNode;
    char * pSop, * pSopNew;
    char * pCube, * pCubeNew;
    int nVars, i, v, * pOrder;
    assert( Abc_NtkHasSop(pNtk) );
    vOrder = Vec_IntAlloc( 100 );
    vStore = Vec_StrAlloc( 100 );
    vCounts = Vec_IntAlloc( 100 );
    vFanins = Vec_IntAlloc( 100 );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        pSop = (char *)pNode->pData;
        nVars = Abc_SopGetVarNum(pSop);
        assert( nVars == Abc_ObjFaninNum(pNode) );
        // count literals
        Vec_IntFill( vCounts, nVars, 0 );
        Abc_SopForEachCube( pSop, nVars, pCube )
            for ( v = 0; v < nVars; v++ )
                if ( pCube[v] != '-' )
                    Vec_IntAddToEntry( vCounts, v, 1 );
        // find good order
        Vec_IntClear( vOrder );
        for ( v = 0; v < nVars; v++ )
            Vec_IntPush( vOrder, v );
        pOrder = Vec_IntArray(vOrder);
        Vec_IntSelectSortCost( pOrder, nVars, vCounts );
        // copy the cover
        Vec_StrGrow( vStore, Abc_SopGetCubeNum(pSop) * (nVars + 3) + 1 );
        memcpy( Vec_StrArray(vStore), pSop, Abc_SopGetCubeNum(pSop) * (nVars + 3) + 1 );
        pSopNew = pCubeNew = pSop;
        pSop = Vec_StrArray(vStore);
        // generate permuted one
        Abc_SopForEachCube( pSop, nVars, pCube )
        {
            for ( v = 0; v < nVars; v++ )
                pCubeNew[v] = '-';
            for ( v = 0; v < nVars; v++ )
                if ( pCube[pOrder[v]] == '0' )
                    pCubeNew[v] = '0';
                else if ( pCube[pOrder[v]] == '1' )
                    pCubeNew[v] = '1';
            pCubeNew += nVars + 3;
        }
        pNode->pData = pSopNew;
        // generate the fanin order
        Vec_IntClear( vFanins );
        for ( v = 0; v < nVars; v++ )
            Vec_IntPush( vFanins, Abc_ObjFaninId( pNode, pOrder[v] ) );
        Vec_IntClear( &pNode->vFanins );
        Vec_IntAppend( &pNode->vFanins, vFanins );
    }
    Vec_IntFree( vFanins );
    Vec_IntFree( vCounts );
    Vec_IntFree( vOrder );
    Vec_StrFree( vStore );
}